

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O1

void __thiscall re2c::HeaderFile::~HeaderFile(HeaderFile *this)

{
  string content;
  long *local_30;
  size_t local_28;
  long local_20 [2];
  
  if (this->file != (FILE *)0x0) {
    std::__cxx11::stringbuf::str();
    fwrite(local_30,1,local_28,(FILE *)this->file);
    fclose((FILE *)this->file);
    if (local_30 != local_20) {
      operator_delete(local_30,local_20[0] + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  std::ios_base::~ios_base((ios_base *)&this->field_0x70);
  return;
}

Assistant:

HeaderFile::~HeaderFile ()
{
	if (file != NULL)
	{
		std::string content = stream.str ();
		fwrite (content.c_str (), 1, content.size (), file);
		fclose (file);
	}
}